

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<cs::pointer>::holder<cs_impl::any_const&>(holder<cs::pointer> *this,any *args)

{
  baseHolder *in_RDI;
  baseHolder *this_00;
  
  baseHolder::baseHolder(in_RDI);
  in_RDI->_vptr_baseHolder = (_func_int **)&PTR__holder_006c3068;
  this_00 = in_RDI + 1;
  any((any *)this_00,(any *)in_RDI);
  cs::pointer::pointer((pointer *)this_00,(var *)in_RDI);
  ~any((any *)0x526093);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}